

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O3

int bip32_key_from_base58_alloc(char *base58,ext_key **output)

{
  int iVar1;
  ext_key *output_00;
  
  if (output == (ext_key **)0x0) {
    iVar1 = -2;
  }
  else {
    output_00 = (ext_key *)wally_calloc(0xc0);
    *output = output_00;
    if (output_00 == (ext_key *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = bip32_key_from_base58(base58,output_00);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int bip32_key_from_base58_alloc(const char *base58,
                                struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_from_base58(base58, *output);
    if (ret != WALLY_OK) {
        wally_free(*output);
        *output = 0;
    }
    return ret;
}